

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
* __thiscall
webfront::http::Response::toBuffers<webfront::networking::TCPNetworkingTS>(Response *this)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Header *header;
  const_iterator __end3;
  const_iterator __begin3;
  vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  *__range3;
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  *buffers;
  mutable_buffer *b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe98 [16];
  __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
  local_118 [2];
  MutableBuffer local_108;
  mutable_buffer local_38 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::vector((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
            *)0x131a7e);
  if ((toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&toBuffers<webfront::networking::TCPNetworkingTS>()::
                                   httpStatus_abi_cxx11_), iVar2 != 0)) {
    ::std::__cxx11::string::string(this_01);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_);
  }
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  ::std::operator+((char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  ::std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
  toString_abi_cxx11_(in_stack_fffffffffffffe98._6_2_);
  ::std::operator+(in_stack_fffffffffffffe88,local_188);
  ::std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
  this_00 = &toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_;
  b = local_38;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffe98._8_8_,in_stack_fffffffffffffe98._0_8_);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  local_108 = networking::
              BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
              ::Buffer<char,std::char_traits<char>,std::allocator<char>>(this_01);
  std::experimental::net::v1::const_buffer::const_buffer((const_buffer *)this_00,b);
  std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
               *)this_00,(value_type *)b);
  local_118[0]._M_current =
       (Header *)
       std::
       vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
       begin((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)b);
  std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
  end((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_> *)b
     );
  while (bVar1 = __gnu_cxx::
                 operator==<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                           ((__normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                             *)this_00,
                            (__normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                             *)b), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
    ::operator*(local_118);
    networking::
    BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
    ::Buffer<char,std::char_traits<char>,std::allocator<char>>(this_01);
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 *)this_00,(value_type *)b);
    networking::
    BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
    ::Buffer<char,2ul>((char (*) [2])0x131cc8);
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 *)this_00,(value_type *)b);
    networking::
    BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
    ::Buffer<char,std::char_traits<char>,std::allocator<char>>(this_01);
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 *)this_00,(value_type *)b);
    networking::
    BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
    ::Buffer<char,2ul>((char (*) [2])0x131d1b);
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 *)this_00,(value_type *)b);
    __gnu_cxx::
    __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
    ::operator++(local_118);
  }
  networking::
  BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
  ::Buffer<char,2ul>((char (*) [2])0x131e24);
  std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
               *)this_00,(value_type *)b);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x131e4d);
  if (!bVar1) {
    networking::
    BasicNetworking<std::experimental::net::v1::const_buffer,std::experimental::net::v1::mutable_buffer>
    ::Buffer<char,std::char_traits<char>,std::allocator<char>>(this_01);
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::push_back((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                 *)this_00,(value_type *)b);
  }
  return (vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
          *)in_RDI;
}

Assistant:

[[nodiscard]] std::vector<typename Net::ConstBuffer> toBuffers() const {
        std::vector<typename Net::ConstBuffer> buffers;
        static std::string httpStatus;
        httpStatus = "HTTP/1.1 " + std::to_string(statusCode) + " " + toString(statusCode) + "\r\n";
        buffers.push_back(Net::Buffer(httpStatus));

        static const char separator[] = {':', ' '};
        static const char crlf[] = {'\r', '\n'};
        for (auto& header : headers) {
            buffers.push_back(Net::Buffer(header.name));
            buffers.push_back(Net::Buffer(separator));
            buffers.push_back(Net::Buffer(header.value));
            buffers.push_back(Net::Buffer(crlf));
        }
        buffers.push_back(Net::Buffer(crlf));
        if (!content.empty()) buffers.push_back(Net::Buffer(content));

        return buffers;
    }